

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.c
# Opt level: O1

char * env_get(char *s)

{
  uint uVar1;
  int iVar2;
  char *s_00;
  long lVar3;
  
  if (s != (char *)0x0) {
    uVar1 = str_len(s);
    s_00 = (char *)*_environ;
    if (s_00 != (char *)0x0) {
      lVar3 = 0;
      while ((iVar2 = str_start(s_00,s), iVar2 == 0 ||
             (*(char *)(*(long *)((long)_environ + lVar3) + (ulong)uVar1) != '='))) {
        s_00 = *(char **)((long)_environ + lVar3 + 8);
        lVar3 = lVar3 + 8;
        if (s_00 == (char *)0x0) {
          return (char *)0x0;
        }
      }
      return (char *)(*(long *)((long)_environ + lVar3) + (ulong)uVar1 + 1);
    }
  }
  return (char *)0x0;
}

Assistant:

extern /*@null@*/char *env_get(const char *s)
{
  int i;
  unsigned int len;

  if (!s) return 0;
  len = str_len(s);
  for (i = 0;environ[i];++i)
    if (str_start(environ[i],s) && (environ[i][len] == '='))
      return environ[i] + len + 1;
  return 0;
}